

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_channel_converter_init
                    (ma_channel_converter_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_channel_converter *pConverter)

{
  ma_result mVar1;
  void *pHeap;
  ma_channel_converter_heap_layout heapLayout;
  ma_channel_converter_heap_layout local_50;
  
  mVar1 = ma_channel_converter_get_heap_layout(pConfig,&local_50);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_50.sizeInBytes == 0) {
    pHeap = (void *)0x0;
LAB_00142913:
    mVar1 = ma_channel_converter_init_preallocated(pConfig,pHeap,pConverter);
    if (mVar1 == MA_SUCCESS) {
      pConverter->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_50.sizeInBytes);
LAB_0014290b:
      if (pHeap != (void *)0x0) goto LAB_00142913;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)
                        (local_50.sizeInBytes,pAllocationCallbacks->pUserData);
      goto LAB_0014290b;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_channel_converter_init(const ma_channel_converter_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_channel_converter* pConverter)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_channel_converter_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_channel_converter_init_preallocated(pConfig, pHeap, pConverter);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pConverter->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}